

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_layout.h
# Opt level: O0

void __thiscall upb::generator::DefPoolPair::~DefPoolPair(DefPoolPair *this)

{
  DefPoolPair *this_local;
  
  DefPool::~DefPool(&this->pool64_);
  DefPool::~DefPool(&this->pool32_);
  return;
}

Assistant:

DefPoolPair() {
    pool32_._SetPlatform(kUpb_MiniTablePlatform_32Bit);
    pool64_._SetPlatform(kUpb_MiniTablePlatform_64Bit);
  }